

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  undefined8 *puVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  uint uVar8;
  BYTE *pStart;
  ulong uVar9;
  seqDef *psVar10;
  byte bVar11;
  ulong uVar12;
  BYTE *pBVar13;
  ulong *puVar14;
  ulong *puVar15;
  int iVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  U32 UVar25;
  uint uVar26;
  ulong *puVar27;
  ulong *puVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  int iVar32;
  ulong *puVar33;
  long lVar34;
  ulong uVar35;
  ulong *puVar36;
  uint uVar37;
  U32 UVar38;
  uint uVar39;
  ulong *puVar40;
  BYTE *base;
  U32 *hashTable;
  BYTE *litLimit_w_4;
  BYTE *litLimit_w_12;
  BYTE *iend;
  BYTE *ilimit;
  BYTE *litLimit_w;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w_8;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  size_t stepSize;
  ulong local_c8;
  ulong *local_c0;
  ulong local_b8;
  ulong local_68;
  
  uVar31 = (ms->cParams).minMatch;
  uVar8 = (ms->cParams).targetLength;
  pUVar5 = ms->hashTable;
  local_c0 = (ulong *)src;
  if (1 < uVar8) {
    pBVar6 = (ms->window).base;
    puVar2 = (ulong *)((long)src + srcSize);
    iVar16 = (int)pBVar6;
    iVar32 = (int)puVar2 - iVar16;
    uVar26 = (ms->window).dictLimit;
    uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar22 = iVar32 - uVar21;
    if (iVar32 - uVar26 <= uVar21) {
      uVar22 = uVar26;
    }
    if (ms->loadedDictEnd != 0) {
      uVar22 = uVar26;
    }
    pBVar20 = pBVar6 + uVar22;
    puVar33 = (ulong *)((ulong)(pBVar20 == (BYTE *)src) + (long)src);
    iVar32 = (int)puVar33 - iVar16;
    uVar37 = iVar32 - uVar21;
    if (iVar32 - uVar26 <= uVar21) {
      uVar37 = uVar26;
    }
    if (ms->loadedDictEnd != 0) {
      uVar37 = uVar26;
    }
    uVar24 = (ulong)(uVar8 + 1);
    uVar8 = *rep;
    uVar26 = rep[1];
    uVar37 = iVar32 - uVar37;
    local_b8._0_4_ = uVar26;
    if (uVar37 < uVar26) {
      local_b8._0_4_ = 0;
    }
    uVar17 = (ulong)(uint)local_b8;
    uVar21 = 0;
    if (uVar8 <= uVar37) {
      uVar21 = uVar8;
    }
    uVar35 = (ulong)uVar21;
    puVar14 = (ulong *)((long)src + (srcSize - 8));
    puVar40 = (ulong *)((long)puVar33 + uVar24);
    puVar27 = (ulong *)((long)puVar33 + uVar24 + 1);
    if (uVar31 == 5) {
      if (puVar27 < puVar14) {
        bVar11 = 0x40 - (char)(ms->cParams).hashLog;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar36 = puVar2 + -4;
        do {
          puVar19 = puVar33 + 0x10;
          uVar30 = *puVar33 * -0x30e4432345000000 >> (bVar11 & 0x3f);
          uVar9 = *(ulong *)((long)puVar33 + 1);
          uVar31 = pUVar5[uVar30];
          uVar21 = (uint)uVar35;
          lVar34 = -uVar35;
          puVar18 = (ulong *)((long)puVar33 + 1);
          uVar23 = uVar24;
          while( true ) {
            puVar15 = puVar40;
            uVar9 = uVar9 * -0x30e4432345000000 >> (bVar11 & 0x3f);
            uVar39 = (int)puVar33 - iVar16;
            iVar32 = *(int *)((long)puVar15 + lVar34);
            pUVar5[uVar30] = uVar39;
            if ((uVar21 != 0) && ((int)*puVar15 == iVar32)) {
              uVar23 = (ulong)(*(char *)((long)puVar15 - 1) ==
                              *(char *)((long)puVar15 + lVar34 + -1));
              puVar33 = (ulong *)((long)puVar15 - uVar23);
              pBVar13 = (BYTE *)((long)puVar15 + (lVar34 - uVar23));
              uVar23 = uVar23 | 4;
              pUVar5[uVar9] = (int)puVar18 - iVar16;
              UVar38 = 1;
              uVar9 = uVar35;
              goto LAB_01905f93;
            }
            if ((uVar22 <= uVar31) &&
               (uVar12 = (ulong)uVar31, (int)*puVar33 == *(int *)(pBVar6 + uVar12)))
            goto LAB_0190604e;
            uVar31 = pUVar5[uVar9];
            uVar12 = (ulong)uVar31;
            uVar30 = *puVar15 * -0x30e4432345000000 >> (bVar11 & 0x3f);
            uVar39 = (int)puVar18 - iVar16;
            pUVar5[uVar9] = uVar39;
            if ((uVar22 <= uVar31) && ((int)*puVar18 == *(int *)(pBVar6 + uVar12))) break;
            uVar31 = pUVar5[uVar30];
            uVar12 = uVar23;
            if (puVar19 <= (ulong *)((long)puVar15 + uVar23)) {
              puVar19 = puVar19 + 0x10;
              uVar12 = uVar23 + 1;
            }
            uVar9 = *puVar27;
            puVar28 = (ulong *)(uVar23 + (long)puVar27);
            puVar40 = (ulong *)((long)puVar15 + uVar23);
            puVar18 = puVar27;
            uVar23 = uVar12;
            puVar27 = puVar28;
            puVar33 = puVar15;
            local_b8 = uVar17;
            if (puVar14 <= puVar28) goto LAB_0190797d;
          }
          uVar9 = uVar30;
          puVar33 = puVar18;
          puVar18 = puVar15;
          if (uVar23 < 5) {
LAB_0190604e:
            pUVar5[uVar9] = (int)puVar18 - iVar16;
          }
          pBVar13 = pBVar6 + uVar12;
          uVar21 = (int)puVar33 - (int)pBVar13;
          uVar9 = (ulong)uVar21;
          UVar38 = uVar21 + 3;
          uVar23 = 4;
          uVar17 = uVar35;
          if ((uVar22 < uVar31) && (local_c0 < puVar33)) {
            pBVar3 = pBVar6 + (uVar12 - 1);
            puVar40 = puVar33;
            while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
                  *(BYTE *)puVar33 == *pBVar13) {
              uVar23 = uVar23 + 1;
              if ((puVar33 <= local_c0) ||
                 (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20)) goto LAB_01905f93;
            }
            pBVar13 = pBVar13 + 1;
            puVar33 = puVar40;
          }
LAB_01905f93:
          puVar40 = (ulong *)((long)puVar33 + uVar23);
          puVar27 = (ulong *)(pBVar13 + uVar23);
          puVar19 = puVar40;
          if (puVar40 < puVar1) {
            if (*puVar27 == *puVar40) {
              lVar34 = 0;
              do {
                puVar27 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                if (puVar1 <= puVar27) {
                  puVar27 = (ulong *)(pBVar13 + lVar34 + uVar23 + 8);
                  puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                  goto LAB_01906102;
                }
                lVar29 = lVar34 + uVar23 + 8;
                uVar35 = *puVar27;
                lVar34 = lVar34 + 8;
              } while (*(ulong *)(pBVar13 + lVar29) == uVar35);
              uVar35 = uVar35 ^ *(ulong *)(pBVar13 + lVar29);
              uVar30 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              local_68 = (uVar30 >> 3 & 0x1fffffff) + lVar34;
            }
            else {
              uVar30 = *puVar40 ^ *puVar27;
              uVar35 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              local_68 = uVar35 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_01906102:
            if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar27 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar19 < puVar2) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar27 == (char)*puVar19));
            }
            local_68 = (long)puVar19 - (long)puVar40;
          }
          uVar35 = (long)puVar33 - (long)local_c0;
          puVar40 = (ulong *)seqStore->lit;
          if (puVar36 < puVar33) {
            ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar36);
LAB_0190617c:
            seqStore->lit = seqStore->lit + uVar35;
            psVar10 = seqStore->sequences;
            if (0xffff < uVar35) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar30 = local_c0[1];
            *puVar40 = *local_c0;
            puVar40[1] = uVar30;
            pBVar13 = seqStore->lit;
            if (0x10 < uVar35) {
              uVar30 = local_c0[3];
              *(ulong *)(pBVar13 + 0x10) = local_c0[2];
              *(ulong *)(pBVar13 + 0x18) = uVar30;
              if (0x20 < (long)uVar35) {
                lVar34 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
                  uVar7 = puVar4[1];
                  pBVar3 = pBVar13 + lVar34 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar7;
                  puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
                  uVar7 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar3 + 0x20 < pBVar13 + uVar35);
              }
              goto LAB_0190617c;
            }
            seqStore->lit = pBVar13 + uVar35;
            psVar10 = seqStore->sequences;
          }
          psVar10->litLength = (U16)uVar35;
          psVar10->offBase = UVar38;
          uVar35 = (local_68 + uVar23) - 3;
          if (0xffff < uVar35) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->mlBase = (U16)uVar35;
          seqStore->sequences = psVar10 + 1;
          local_c0 = (ulong *)((long)puVar33 + local_68 + uVar23);
          if (local_c0 <= puVar14) {
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar39 + 2) * -0x30e4432345000000) >>
                   (bVar11 & 0x3f)] = uVar39 + 2;
            pUVar5[(ulong)(*(long *)((long)local_c0 + -2) * -0x30e4432345000000) >> (bVar11 & 0x3f)]
                 = ((int)local_c0 + -2) - iVar16;
            uVar35 = uVar17;
            if ((int)uVar17 == 0) {
              uVar17 = 0;
            }
            else {
              do {
                uVar23 = uVar9;
                uVar17 = uVar35;
                uVar9 = uVar23;
                if ((int)*local_c0 != *(int *)((long)local_c0 - uVar35)) break;
                lVar34 = -uVar35;
                puVar33 = (ulong *)((long)local_c0 + 4);
                puVar27 = (ulong *)((long)local_c0 + lVar34 + 4);
                puVar40 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar27 == *puVar33) {
                    lVar29 = 0;
                    do {
                      puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                      if (puVar1 <= puVar40) {
                        puVar27 = (ulong *)((long)local_c0 + lVar34 + lVar29 + 0xc);
                        puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                        goto LAB_0190636b;
                      }
                      uVar17 = *(ulong *)((long)local_c0 + lVar29 + lVar34 + 0xc);
                      uVar9 = *puVar40;
                      lVar29 = lVar29 + 8;
                    } while (uVar17 == uVar9);
                    uVar9 = uVar9 ^ uVar17;
                    uVar17 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar29;
                  }
                  else {
                    uVar9 = *puVar33 ^ *puVar27;
                    uVar17 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar17 = uVar17 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0190636b:
                  if ((puVar40 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar40))
                  {
                    puVar40 = (ulong *)((long)puVar40 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar40 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar40 < puVar2) {
                    puVar40 = (ulong *)((long)puVar40 + (ulong)((char)*puVar27 == (char)*puVar40));
                  }
                  uVar17 = (long)puVar40 - (long)puVar33;
                }
                pUVar5[*local_c0 * -0x30e4432345000000 >> (bVar11 & 0x3f)] = (int)local_c0 - iVar16;
                puVar33 = (ulong *)seqStore->lit;
                if (puVar36 < local_c0) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar33,(BYTE *)local_c0,(BYTE *)local_c0,(BYTE *)puVar36);
                }
                else {
                  uVar9 = local_c0[1];
                  *puVar33 = *local_c0;
                  puVar33[1] = uVar9;
                }
                psVar10 = seqStore->sequences;
                psVar10->litLength = 0;
                psVar10->offBase = 1;
                if (0xffff < uVar17 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                }
                local_c0 = (ulong *)((long)local_c0 + uVar17 + 4);
                psVar10->mlBase = (U16)(uVar17 + 1);
                seqStore->sequences = psVar10 + 1;
                uVar17 = uVar23;
                uVar9 = uVar35;
                uVar35 = uVar23;
              } while (local_c0 <= puVar14);
            }
          }
          local_b8._0_4_ = (uint)uVar17;
          puVar40 = (ulong *)((long)local_c0 + uVar24);
          puVar27 = (ulong *)((long)local_c0 + uVar24 + 1);
          uVar21 = (uint)uVar9;
          puVar33 = local_c0;
          uVar35 = uVar9;
        } while (puVar27 < puVar14);
      }
      goto LAB_0190798e;
    }
    if (uVar31 == 6) {
      if (puVar27 < puVar14) {
        bVar11 = 0x40 - (char)(ms->cParams).hashLog;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar36 = puVar2 + -4;
        do {
          puVar19 = puVar33 + 0x10;
          uVar30 = *puVar33 * -0x30e4432340650000 >> (bVar11 & 0x3f);
          uVar9 = *(ulong *)((long)puVar33 + 1);
          uVar31 = pUVar5[uVar30];
          uVar21 = (uint)uVar35;
          lVar34 = -uVar35;
          puVar18 = (ulong *)((long)puVar33 + 1);
          uVar23 = uVar24;
          while( true ) {
            puVar15 = puVar40;
            uVar9 = uVar9 * -0x30e4432340650000 >> (bVar11 & 0x3f);
            UVar38 = (int)puVar33 - iVar16;
            iVar32 = *(int *)((long)puVar15 + lVar34);
            pUVar5[uVar30] = UVar38;
            if ((uVar21 != 0) && ((int)*puVar15 == iVar32)) {
              uVar23 = (ulong)(*(char *)((long)puVar15 - 1) ==
                              *(char *)((long)puVar15 + lVar34 + -1));
              puVar33 = (ulong *)((long)puVar15 - uVar23);
              pBVar13 = (BYTE *)((long)puVar15 + (lVar34 - uVar23));
              uVar23 = uVar23 | 4;
              pUVar5[uVar9] = (int)puVar18 - iVar16;
              UVar25 = 1;
              uVar9 = uVar35;
              goto LAB_01905208;
            }
            if ((uVar22 <= uVar31) &&
               (uVar12 = (ulong)uVar31, (int)*puVar33 == *(int *)(pBVar6 + uVar12)))
            goto LAB_019052c0;
            uVar31 = pUVar5[uVar9];
            uVar12 = (ulong)uVar31;
            uVar30 = *puVar15 * -0x30e4432340650000 >> (bVar11 & 0x3f);
            UVar38 = (int)puVar18 - iVar16;
            pUVar5[uVar9] = UVar38;
            if ((uVar22 <= uVar31) && ((int)*puVar18 == *(int *)(pBVar6 + uVar12))) break;
            uVar31 = pUVar5[uVar30];
            uVar12 = uVar23;
            if (puVar19 <= (ulong *)((long)puVar15 + uVar23)) {
              puVar19 = puVar19 + 0x10;
              uVar12 = uVar23 + 1;
            }
            uVar9 = *puVar27;
            puVar28 = (ulong *)(uVar23 + (long)puVar27);
            puVar40 = (ulong *)((long)puVar15 + uVar23);
            puVar18 = puVar27;
            uVar23 = uVar12;
            puVar27 = puVar28;
            puVar33 = puVar15;
            local_b8 = uVar17;
            if (puVar14 <= puVar28) goto LAB_0190793a;
          }
          puVar33 = puVar18;
          puVar18 = puVar15;
          uVar9 = uVar30;
          if (uVar23 < 5) {
LAB_019052c0:
            pUVar5[uVar9] = (int)puVar18 - iVar16;
          }
          pBVar13 = pBVar6 + uVar12;
          uVar21 = (int)puVar33 - (int)pBVar13;
          uVar9 = (ulong)uVar21;
          UVar25 = uVar21 + 3;
          uVar23 = 4;
          uVar17 = uVar35;
          if ((uVar22 < uVar31) && (local_c0 < puVar33)) {
            pBVar3 = pBVar6 + (uVar12 - 1);
            puVar40 = puVar33;
            while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
                  *(BYTE *)puVar33 == *pBVar13) {
              uVar23 = uVar23 + 1;
              if ((puVar33 <= local_c0) ||
                 (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20)) goto LAB_01905208;
            }
            pBVar13 = pBVar13 + 1;
            puVar33 = puVar40;
          }
LAB_01905208:
          puVar40 = (ulong *)((long)puVar33 + uVar23);
          puVar27 = (ulong *)(pBVar13 + uVar23);
          puVar19 = puVar40;
          if (puVar40 < puVar1) {
            if (*puVar27 == *puVar40) {
              lVar34 = 0;
              do {
                puVar27 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                if (puVar1 <= puVar27) {
                  puVar27 = (ulong *)(pBVar13 + lVar34 + uVar23 + 8);
                  puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                  goto LAB_01905375;
                }
                lVar29 = lVar34 + uVar23 + 8;
                uVar35 = *puVar27;
                lVar34 = lVar34 + 8;
              } while (*(ulong *)(pBVar13 + lVar29) == uVar35);
              uVar35 = uVar35 ^ *(ulong *)(pBVar13 + lVar29);
              uVar30 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar35 = (uVar30 >> 3 & 0x1fffffff) + lVar34;
            }
            else {
              uVar30 = *puVar40 ^ *puVar27;
              uVar35 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = uVar35 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_01905375:
            if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar27 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar19 < puVar2) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar27 == (char)*puVar19));
            }
            uVar35 = (long)puVar19 - (long)puVar40;
          }
          uVar30 = (long)puVar33 - (long)local_c0;
          puVar40 = (ulong *)seqStore->lit;
          if (puVar36 < puVar33) {
            ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar36);
LAB_019053ea:
            seqStore->lit = seqStore->lit + uVar30;
            psVar10 = seqStore->sequences;
            if (0xffff < uVar30) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar12 = local_c0[1];
            *puVar40 = *local_c0;
            puVar40[1] = uVar12;
            pBVar13 = seqStore->lit;
            if (0x10 < uVar30) {
              uVar12 = local_c0[3];
              *(ulong *)(pBVar13 + 0x10) = local_c0[2];
              *(ulong *)(pBVar13 + 0x18) = uVar12;
              if (0x20 < (long)uVar30) {
                lVar34 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
                  uVar7 = puVar4[1];
                  pBVar3 = pBVar13 + lVar34 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar7;
                  puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
                  uVar7 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar3 + 0x20 < pBVar13 + uVar30);
              }
              goto LAB_019053ea;
            }
            seqStore->lit = pBVar13 + uVar30;
            psVar10 = seqStore->sequences;
          }
          psVar10->litLength = (U16)uVar30;
          psVar10->offBase = UVar25;
          uVar30 = (uVar35 + uVar23) - 3;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->mlBase = (U16)uVar30;
          seqStore->sequences = psVar10 + 1;
          local_c0 = (ulong *)((long)puVar33 + uVar35 + uVar23);
          if (local_c0 <= puVar14) {
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)UVar38 + 2) * -0x30e4432340650000) >>
                   (bVar11 & 0x3f)] = UVar38 + 2;
            pUVar5[(ulong)(*(long *)((long)local_c0 + -2) * -0x30e4432340650000) >> (bVar11 & 0x3f)]
                 = ((int)local_c0 + -2) - iVar16;
            uVar35 = uVar17;
            if ((int)uVar17 == 0) {
              uVar17 = 0;
            }
            else {
              do {
                uVar23 = uVar9;
                uVar17 = uVar35;
                uVar9 = uVar23;
                if ((int)*local_c0 != *(int *)((long)local_c0 - uVar35)) break;
                lVar34 = -uVar35;
                puVar33 = (ulong *)((long)local_c0 + 4);
                puVar27 = (ulong *)((long)local_c0 + lVar34 + 4);
                puVar40 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar27 == *puVar33) {
                    lVar29 = 0;
                    do {
                      puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                      if (puVar1 <= puVar40) {
                        puVar27 = (ulong *)((long)local_c0 + lVar34 + lVar29 + 0xc);
                        puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                        goto LAB_019055dd;
                      }
                      uVar17 = *(ulong *)((long)local_c0 + lVar29 + lVar34 + 0xc);
                      uVar9 = *puVar40;
                      lVar29 = lVar29 + 8;
                    } while (uVar17 == uVar9);
                    uVar9 = uVar9 ^ uVar17;
                    uVar17 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar29;
                  }
                  else {
                    uVar9 = *puVar33 ^ *puVar27;
                    uVar17 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar17 = uVar17 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_019055dd:
                  if ((puVar40 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar40))
                  {
                    puVar40 = (ulong *)((long)puVar40 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar40 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar40 < puVar2) {
                    puVar40 = (ulong *)((long)puVar40 + (ulong)((char)*puVar27 == (char)*puVar40));
                  }
                  uVar17 = (long)puVar40 - (long)puVar33;
                }
                pUVar5[*local_c0 * -0x30e4432340650000 >> (bVar11 & 0x3f)] = (int)local_c0 - iVar16;
                puVar33 = (ulong *)seqStore->lit;
                if (puVar36 < local_c0) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar33,(BYTE *)local_c0,(BYTE *)local_c0,(BYTE *)puVar36);
                }
                else {
                  uVar9 = local_c0[1];
                  *puVar33 = *local_c0;
                  puVar33[1] = uVar9;
                }
                psVar10 = seqStore->sequences;
                psVar10->litLength = 0;
                psVar10->offBase = 1;
                if (0xffff < uVar17 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                }
                local_c0 = (ulong *)((long)local_c0 + uVar17 + 4);
                psVar10->mlBase = (U16)(uVar17 + 1);
                seqStore->sequences = psVar10 + 1;
                uVar17 = uVar23;
                uVar9 = uVar35;
                uVar35 = uVar23;
              } while (local_c0 <= puVar14);
            }
          }
          local_b8._0_4_ = (uint)uVar17;
          puVar40 = (ulong *)((long)local_c0 + uVar24);
          puVar27 = (ulong *)((long)local_c0 + uVar24 + 1);
          uVar21 = (uint)uVar9;
          puVar33 = local_c0;
          uVar35 = uVar9;
        } while (puVar27 < puVar14);
      }
    }
    else {
      if (uVar31 != 7) {
        if (puVar27 < puVar14) {
          bVar11 = 0x20 - (char)(ms->cParams).hashLog;
          puVar1 = (ulong *)((long)puVar2 - 7);
          puVar36 = puVar2 + -4;
          do {
            puVar19 = puVar33 + 0x10;
            uVar23 = (ulong)((uint)((int)*puVar33 * -0x61c8864f) >> (bVar11 & 0x1f));
            iVar32 = *(int *)((long)puVar33 + 1);
            uVar31 = pUVar5[uVar23];
            uVar21 = (uint)uVar35;
            lVar34 = -uVar35;
            uVar9 = uVar24;
            puVar18 = (ulong *)((long)puVar33 + 1);
            while( true ) {
              puVar28 = puVar27;
              puVar15 = puVar40;
              uVar30 = (ulong)((uint)(iVar32 * -0x61c8864f) >> (bVar11 & 0x1f));
              UVar38 = (int)puVar33 - iVar16;
              iVar32 = *(int *)((long)puVar15 + lVar34);
              pUVar5[uVar23] = UVar38;
              if ((uVar21 != 0) && ((int)*puVar15 == iVar32)) {
                uVar23 = (ulong)(*(char *)((long)puVar15 - 1) ==
                                *(char *)((long)puVar15 + lVar34 + -1));
                puVar33 = (ulong *)((long)puVar15 - uVar23);
                pBVar13 = (BYTE *)((long)puVar15 + (lVar34 - uVar23));
                uVar23 = uVar23 | 4;
                pUVar5[uVar30] = (int)puVar18 - iVar16;
                UVar25 = 1;
                uVar9 = uVar35;
                goto LAB_01906d71;
              }
              if ((uVar22 <= uVar31) &&
                 (uVar12 = (ulong)uVar31, puVar40 = puVar18,
                 (int)*puVar33 == *(int *)(pBVar6 + uVar12))) goto LAB_01906e2e;
              uVar31 = pUVar5[uVar30];
              uVar12 = (ulong)uVar31;
              uVar23 = (ulong)((uint)((int)*puVar15 * -0x61c8864f) >> (bVar11 & 0x1f));
              UVar38 = (int)puVar18 - iVar16;
              pUVar5[uVar30] = UVar38;
              if ((uVar22 <= uVar31) && ((int)*puVar18 == *(int *)(pBVar6 + uVar12))) break;
              uVar31 = pUVar5[uVar23];
              uVar30 = uVar9;
              if (puVar19 <= (ulong *)((long)puVar15 + uVar9)) {
                puVar19 = puVar19 + 0x10;
                uVar30 = uVar9 + 1;
              }
              iVar32 = (int)*puVar28;
              puVar27 = (ulong *)(uVar9 + (long)puVar28);
              puVar40 = (ulong *)((long)puVar15 + uVar9);
              uVar9 = uVar30;
              puVar18 = puVar28;
              puVar33 = puVar15;
              local_b8 = uVar17;
              if (puVar14 <= puVar27) goto LAB_0190797d;
            }
            puVar40 = puVar15;
            uVar30 = uVar23;
            puVar33 = puVar18;
            if (uVar9 < 5) {
LAB_01906e2e:
              pUVar5[uVar30] = (int)puVar40 - iVar16;
            }
            pBVar13 = pBVar6 + uVar12;
            uVar21 = (int)puVar33 - (int)pBVar13;
            uVar9 = (ulong)uVar21;
            UVar25 = uVar21 + 3;
            uVar23 = 4;
            uVar17 = uVar35;
            if ((uVar22 < uVar31) && (local_c0 < puVar33)) {
              pBVar3 = pBVar6 + (uVar12 - 1);
              puVar40 = puVar33;
              while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
                    *(BYTE *)puVar33 == *pBVar13) {
                uVar23 = uVar23 + 1;
                if ((puVar33 <= local_c0) ||
                   (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20))
                goto LAB_01906d71;
              }
              pBVar13 = pBVar13 + 1;
              puVar33 = puVar40;
            }
LAB_01906d71:
            puVar40 = (ulong *)((long)puVar33 + uVar23);
            puVar27 = (ulong *)(pBVar13 + uVar23);
            puVar19 = puVar40;
            if (puVar40 < puVar1) {
              if (*puVar27 == *puVar40) {
                lVar34 = 0;
                do {
                  puVar27 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                  if (puVar1 <= puVar27) {
                    puVar27 = (ulong *)(pBVar13 + lVar34 + uVar23 + 8);
                    puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                    goto LAB_01906ed0;
                  }
                  lVar29 = lVar34 + uVar23 + 8;
                  uVar35 = *puVar27;
                  lVar34 = lVar34 + 8;
                } while (*(ulong *)(pBVar13 + lVar29) == uVar35);
                uVar35 = uVar35 ^ *(ulong *)(pBVar13 + lVar29);
                uVar30 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar35 = (uVar30 >> 3 & 0x1fffffff) + lVar34;
              }
              else {
                uVar30 = *puVar40 ^ *puVar27;
                uVar35 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_01906ed0:
              if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar27 == (short)*puVar19))
              {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar19 < puVar2) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar27 == (char)*puVar19));
              }
              uVar35 = (long)puVar19 - (long)puVar40;
            }
            uVar30 = (long)puVar33 - (long)local_c0;
            puVar40 = (ulong *)seqStore->lit;
            if (puVar36 < puVar33) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar36);
LAB_01906f4f:
              seqStore->lit = seqStore->lit + uVar30;
              psVar10 = seqStore->sequences;
              if (0xffff < uVar30) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar12 = local_c0[1];
              *puVar40 = *local_c0;
              puVar40[1] = uVar12;
              pBVar13 = seqStore->lit;
              if (0x10 < uVar30) {
                uVar12 = local_c0[3];
                *(ulong *)(pBVar13 + 0x10) = local_c0[2];
                *(ulong *)(pBVar13 + 0x18) = uVar12;
                if (0x20 < (long)uVar30) {
                  lVar34 = 0;
                  do {
                    puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
                    uVar7 = puVar4[1];
                    pBVar3 = pBVar13 + lVar34 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar4;
                    *(undefined8 *)(pBVar3 + 8) = uVar7;
                    puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
                    uVar7 = puVar4[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar13 + uVar30);
                }
                goto LAB_01906f4f;
              }
              seqStore->lit = pBVar13 + uVar30;
              psVar10 = seqStore->sequences;
            }
            psVar10->litLength = (U16)uVar30;
            psVar10->offBase = UVar25;
            uVar30 = (uVar35 + uVar23) - 3;
            if (0xffff < uVar30) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar10->mlBase = (U16)uVar30;
            seqStore->sequences = psVar10 + 1;
            local_c0 = (ulong *)((long)puVar33 + uVar35 + uVar23);
            if (local_c0 <= puVar14) {
              pUVar5[(uint)(*(int *)(pBVar6 + (ulong)UVar38 + 2) * -0x61c8864f) >> (bVar11 & 0x1f)]
                   = UVar38 + 2;
              pUVar5[(uint)(*(int *)((long)local_c0 + -2) * -0x61c8864f) >> (bVar11 & 0x1f)] =
                   ((int)local_c0 + -2) - iVar16;
              uVar35 = uVar17;
              if ((int)uVar17 == 0) {
                uVar17 = 0;
              }
              else {
                do {
                  uVar23 = uVar9;
                  uVar17 = uVar35;
                  uVar9 = uVar23;
                  if ((int)*local_c0 != *(int *)((long)local_c0 - uVar35)) break;
                  lVar34 = -uVar35;
                  puVar33 = (ulong *)((long)local_c0 + 4);
                  puVar27 = (ulong *)((long)local_c0 + lVar34 + 4);
                  puVar40 = puVar33;
                  if (puVar33 < puVar1) {
                    if (*puVar27 == *puVar33) {
                      lVar29 = 0;
                      do {
                        puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                        if (puVar1 <= puVar40) {
                          puVar27 = (ulong *)((long)local_c0 + lVar34 + lVar29 + 0xc);
                          puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                          goto LAB_0190712c;
                        }
                        uVar17 = *(ulong *)((long)local_c0 + lVar29 + lVar34 + 0xc);
                        uVar9 = *puVar40;
                        lVar29 = lVar29 + 8;
                      } while (uVar17 == uVar9);
                      uVar9 = uVar9 ^ uVar17;
                      uVar17 = 0;
                      if (uVar9 != 0) {
                        for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                        }
                      }
                      uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar29;
                    }
                    else {
                      uVar9 = *puVar33 ^ *puVar27;
                      uVar17 = 0;
                      if (uVar9 != 0) {
                        for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                        }
                      }
                      uVar17 = uVar17 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0190712c:
                    if ((puVar40 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar40)
                       ) {
                      puVar40 = (ulong *)((long)puVar40 + 4);
                      puVar27 = (ulong *)((long)puVar27 + 4);
                    }
                    if ((puVar40 < (ulong *)((long)puVar2 - 1U)) &&
                       ((short)*puVar27 == (short)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 2);
                      puVar27 = (ulong *)((long)puVar27 + 2);
                    }
                    if (puVar40 < puVar2) {
                      puVar40 = (ulong *)((long)puVar40 + (ulong)((char)*puVar27 == (char)*puVar40))
                      ;
                    }
                    uVar17 = (long)puVar40 - (long)puVar33;
                  }
                  pUVar5[(uint)((int)*local_c0 * -0x61c8864f) >> (bVar11 & 0x1f)] =
                       (int)local_c0 - iVar16;
                  puVar33 = (ulong *)seqStore->lit;
                  if (puVar36 < local_c0) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar33,(BYTE *)local_c0,(BYTE *)local_c0,(BYTE *)puVar36);
                  }
                  else {
                    uVar9 = local_c0[1];
                    *puVar33 = *local_c0;
                    puVar33[1] = uVar9;
                  }
                  psVar10 = seqStore->sequences;
                  psVar10->litLength = 0;
                  psVar10->offBase = 1;
                  if (0xffff < uVar17 + 1) {
                    seqStore->longLengthType = ZSTD_llt_matchLength;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                  }
                  local_c0 = (ulong *)((long)local_c0 + uVar17 + 4);
                  psVar10->mlBase = (U16)(uVar17 + 1);
                  seqStore->sequences = psVar10 + 1;
                  uVar17 = uVar23;
                  uVar9 = uVar35;
                  uVar35 = uVar23;
                } while (local_c0 <= puVar14);
              }
            }
            local_b8._0_4_ = (uint)uVar17;
            puVar40 = (ulong *)((long)local_c0 + uVar24);
            puVar27 = (ulong *)((long)local_c0 + uVar24 + 1);
            uVar21 = (uint)uVar9;
            puVar33 = local_c0;
            uVar35 = uVar9;
          } while (puVar27 < puVar14);
        }
        goto LAB_0190798e;
      }
      if (puVar27 < puVar14) {
        bVar11 = 0x40 - (char)(ms->cParams).hashLog;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar36 = puVar2 + -4;
        do {
          puVar19 = puVar33 + 0x10;
          uVar30 = *puVar33 * -0x30e44323405a9d00 >> (bVar11 & 0x3f);
          uVar9 = *(ulong *)((long)puVar33 + 1);
          uVar31 = pUVar5[uVar30];
          uVar21 = (uint)uVar35;
          lVar34 = -uVar35;
          puVar18 = (ulong *)((long)puVar33 + 1);
          uVar23 = uVar24;
          while( true ) {
            puVar15 = puVar40;
            uVar9 = uVar9 * -0x30e44323405a9d00 >> (bVar11 & 0x3f);
            UVar38 = (int)puVar33 - iVar16;
            iVar32 = *(int *)((long)puVar15 + lVar34);
            pUVar5[uVar30] = UVar38;
            if ((uVar21 != 0) && ((int)*puVar15 == iVar32)) {
              uVar23 = (ulong)(*(char *)((long)puVar15 - 1) ==
                              *(char *)((long)puVar15 + lVar34 + -1));
              puVar33 = (ulong *)((long)puVar15 - uVar23);
              pBVar13 = (BYTE *)((long)puVar15 + (lVar34 - uVar23));
              uVar23 = uVar23 | 4;
              pUVar5[uVar9] = (int)puVar18 - iVar16;
              UVar25 = 1;
              uVar9 = uVar35;
              goto LAB_019043ac;
            }
            if ((uVar22 <= uVar31) &&
               (uVar12 = (ulong)uVar31, (int)*puVar33 == *(int *)(pBVar6 + uVar12)))
            goto LAB_01904464;
            uVar31 = pUVar5[uVar9];
            uVar12 = (ulong)uVar31;
            uVar30 = *puVar15 * -0x30e44323405a9d00 >> (bVar11 & 0x3f);
            UVar38 = (int)puVar18 - iVar16;
            pUVar5[uVar9] = UVar38;
            if ((uVar22 <= uVar31) && ((int)*puVar18 == *(int *)(pBVar6 + uVar12))) break;
            uVar31 = pUVar5[uVar30];
            uVar12 = uVar23;
            if (puVar19 <= (ulong *)((long)puVar15 + uVar23)) {
              puVar19 = puVar19 + 0x10;
              uVar12 = uVar23 + 1;
            }
            uVar9 = *puVar27;
            puVar28 = (ulong *)(uVar23 + (long)puVar27);
            puVar40 = (ulong *)((long)puVar15 + uVar23);
            puVar18 = puVar27;
            uVar23 = uVar12;
            puVar27 = puVar28;
            puVar33 = puVar15;
            local_b8 = uVar17;
            if (puVar14 <= puVar28) goto LAB_0190793a;
          }
          puVar33 = puVar18;
          puVar18 = puVar15;
          uVar9 = uVar30;
          if (uVar23 < 5) {
LAB_01904464:
            pUVar5[uVar9] = (int)puVar18 - iVar16;
          }
          pBVar13 = pBVar6 + uVar12;
          uVar21 = (int)puVar33 - (int)pBVar13;
          uVar9 = (ulong)uVar21;
          UVar25 = uVar21 + 3;
          uVar23 = 4;
          uVar17 = uVar35;
          if ((uVar22 < uVar31) && (local_c0 < puVar33)) {
            pBVar3 = pBVar6 + (uVar12 - 1);
            puVar40 = puVar33;
            while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
                  *(BYTE *)puVar33 == *pBVar13) {
              uVar23 = uVar23 + 1;
              if ((puVar33 <= local_c0) ||
                 (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20)) goto LAB_019043ac;
            }
            pBVar13 = pBVar13 + 1;
            puVar33 = puVar40;
          }
LAB_019043ac:
          puVar40 = (ulong *)((long)puVar33 + uVar23);
          puVar27 = (ulong *)(pBVar13 + uVar23);
          puVar19 = puVar40;
          if (puVar40 < puVar1) {
            if (*puVar27 == *puVar40) {
              lVar34 = 0;
              do {
                puVar27 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                if (puVar1 <= puVar27) {
                  puVar27 = (ulong *)(pBVar13 + lVar34 + uVar23 + 8);
                  puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar23 + 8);
                  goto LAB_01904519;
                }
                lVar29 = lVar34 + uVar23 + 8;
                uVar35 = *puVar27;
                lVar34 = lVar34 + 8;
              } while (*(ulong *)(pBVar13 + lVar29) == uVar35);
              uVar35 = uVar35 ^ *(ulong *)(pBVar13 + lVar29);
              uVar30 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar35 = (uVar30 >> 3 & 0x1fffffff) + lVar34;
            }
            else {
              uVar30 = *puVar40 ^ *puVar27;
              uVar35 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = uVar35 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_01904519:
            if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar27 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar19 < puVar2) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar27 == (char)*puVar19));
            }
            uVar35 = (long)puVar19 - (long)puVar40;
          }
          uVar30 = (long)puVar33 - (long)local_c0;
          puVar40 = (ulong *)seqStore->lit;
          if (puVar36 < puVar33) {
            ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar36);
LAB_0190458e:
            seqStore->lit = seqStore->lit + uVar30;
            psVar10 = seqStore->sequences;
            if (0xffff < uVar30) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar12 = local_c0[1];
            *puVar40 = *local_c0;
            puVar40[1] = uVar12;
            pBVar13 = seqStore->lit;
            if (0x10 < uVar30) {
              uVar12 = local_c0[3];
              *(ulong *)(pBVar13 + 0x10) = local_c0[2];
              *(ulong *)(pBVar13 + 0x18) = uVar12;
              if (0x20 < (long)uVar30) {
                lVar34 = 0;
                do {
                  puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
                  uVar7 = puVar4[1];
                  pBVar3 = pBVar13 + lVar34 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar7;
                  puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
                  uVar7 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar3 + 0x20 < pBVar13 + uVar30);
              }
              goto LAB_0190458e;
            }
            seqStore->lit = pBVar13 + uVar30;
            psVar10 = seqStore->sequences;
          }
          psVar10->litLength = (U16)uVar30;
          psVar10->offBase = UVar25;
          uVar30 = (uVar35 + uVar23) - 3;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->mlBase = (U16)uVar30;
          seqStore->sequences = psVar10 + 1;
          local_c0 = (ulong *)((long)puVar33 + uVar35 + uVar23);
          if (local_c0 <= puVar14) {
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)UVar38 + 2) * -0x30e44323405a9d00) >>
                   (bVar11 & 0x3f)] = UVar38 + 2;
            pUVar5[(ulong)(*(long *)((long)local_c0 + -2) * -0x30e44323405a9d00) >> (bVar11 & 0x3f)]
                 = ((int)local_c0 + -2) - iVar16;
            uVar35 = uVar17;
            if ((int)uVar17 == 0) {
              uVar17 = 0;
            }
            else {
              do {
                uVar23 = uVar9;
                uVar17 = uVar35;
                uVar9 = uVar23;
                if ((int)*local_c0 != *(int *)((long)local_c0 - uVar35)) break;
                lVar34 = -uVar35;
                puVar33 = (ulong *)((long)local_c0 + 4);
                puVar27 = (ulong *)((long)local_c0 + lVar34 + 4);
                puVar40 = puVar33;
                if (puVar33 < puVar1) {
                  if (*puVar27 == *puVar33) {
                    lVar29 = 0;
                    do {
                      puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                      if (puVar1 <= puVar40) {
                        puVar27 = (ulong *)((long)local_c0 + lVar34 + lVar29 + 0xc);
                        puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                        goto LAB_01904781;
                      }
                      uVar17 = *(ulong *)((long)local_c0 + lVar29 + lVar34 + 0xc);
                      uVar9 = *puVar40;
                      lVar29 = lVar29 + 8;
                    } while (uVar17 == uVar9);
                    uVar9 = uVar9 ^ uVar17;
                    uVar17 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar29;
                  }
                  else {
                    uVar9 = *puVar33 ^ *puVar27;
                    uVar17 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar17 = uVar17 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_01904781:
                  if ((puVar40 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar27 == (int)*puVar40))
                  {
                    puVar40 = (ulong *)((long)puVar40 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar40 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar40 < puVar2) {
                    puVar40 = (ulong *)((long)puVar40 + (ulong)((char)*puVar27 == (char)*puVar40));
                  }
                  uVar17 = (long)puVar40 - (long)puVar33;
                }
                pUVar5[*local_c0 * -0x30e44323405a9d00 >> (bVar11 & 0x3f)] = (int)local_c0 - iVar16;
                puVar33 = (ulong *)seqStore->lit;
                if (puVar36 < local_c0) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar33,(BYTE *)local_c0,(BYTE *)local_c0,(BYTE *)puVar36);
                }
                else {
                  uVar9 = local_c0[1];
                  *puVar33 = *local_c0;
                  puVar33[1] = uVar9;
                }
                psVar10 = seqStore->sequences;
                psVar10->litLength = 0;
                psVar10->offBase = 1;
                if (0xffff < uVar17 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                }
                local_c0 = (ulong *)((long)local_c0 + uVar17 + 4);
                psVar10->mlBase = (U16)(uVar17 + 1);
                seqStore->sequences = psVar10 + 1;
                uVar17 = uVar23;
                uVar9 = uVar35;
                uVar35 = uVar23;
              } while (local_c0 <= puVar14);
            }
          }
          local_b8._0_4_ = (uint)uVar17;
          puVar40 = (ulong *)((long)local_c0 + uVar24);
          puVar27 = (ulong *)((long)local_c0 + uVar24 + 1);
          uVar21 = (uint)uVar9;
          puVar33 = local_c0;
          uVar35 = uVar9;
        } while (puVar27 < puVar14);
      }
    }
LAB_0190794b:
    if (uVar26 <= uVar37) {
      uVar26 = 0;
    }
    uVar31 = uVar26;
    if (uVar21 != 0) {
      uVar31 = uVar8;
    }
    if (uVar8 <= uVar37) {
      uVar31 = uVar26;
      uVar8 = 0;
    }
    if (uVar21 != 0) {
      uVar8 = uVar21;
    }
    goto LAB_019079be;
  }
  pBVar6 = (ms->window).base;
  puVar2 = (ulong *)((long)src + srcSize);
  iVar32 = (int)pBVar6;
  iVar16 = (int)puVar2 - iVar32;
  uVar8 = (ms->window).dictLimit;
  uVar22 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar26 = iVar16 - uVar22;
  if (iVar16 - uVar8 <= uVar22) {
    uVar26 = uVar8;
  }
  if (ms->loadedDictEnd != 0) {
    uVar26 = uVar8;
  }
  pBVar20 = pBVar6 + uVar26;
  puVar33 = (ulong *)((long)src + (ulong)(pBVar20 == (BYTE *)src));
  iVar16 = (int)puVar33 - iVar32;
  uVar21 = iVar16 - uVar22;
  if (iVar16 - uVar8 <= uVar22) {
    uVar21 = uVar8;
  }
  if (ms->loadedDictEnd != 0) {
    uVar21 = uVar8;
  }
  uVar8 = *rep;
  uVar22 = rep[1];
  uVar21 = iVar16 - uVar21;
  local_c8._0_4_ = uVar22;
  if (uVar21 < uVar22) {
    local_c8._0_4_ = 0;
  }
  uVar24 = (ulong)(uint)local_c8;
  uVar37 = 0;
  if (uVar8 <= uVar21) {
    uVar37 = uVar8;
  }
  uVar17 = (ulong)uVar37;
  puVar14 = (ulong *)((long)src + (srcSize - 8));
  puVar40 = (ulong *)((long)src + (ulong)(pBVar20 == (BYTE *)src) + 3);
  if (uVar31 == 5) {
    if (puVar40 < puVar14) {
      bVar11 = 0x40 - (char)(ms->cParams).hashLog;
      puVar27 = (ulong *)((long)puVar2 - 7);
      puVar1 = puVar2 + -4;
      local_c0 = (ulong *)src;
      do {
        local_c8._0_4_ = (uint)uVar24;
        puVar18 = puVar33 + 0x10;
        uVar23 = *puVar33 * -0x30e4432345000000 >> (bVar11 & 0x3f);
        uVar35 = *(ulong *)((long)puVar33 + 1);
        uVar31 = pUVar5[uVar23];
        uVar37 = (uint)uVar17;
        lVar34 = -uVar17;
        puVar36 = (ulong *)((long)puVar33 + 2);
        uVar9 = 2;
        puVar19 = (ulong *)((long)puVar33 + 1);
        while( true ) {
          puVar28 = puVar36;
          puVar15 = puVar40;
          uVar35 = uVar35 * -0x30e4432345000000 >> (bVar11 & 0x3f);
          uVar39 = (int)puVar33 - iVar32;
          iVar16 = *(int *)((long)puVar28 + lVar34);
          pUVar5[uVar23] = uVar39;
          if ((uVar37 != 0) && ((int)*puVar28 == iVar16)) {
            uVar9 = (ulong)(*(char *)((long)puVar28 - 1) == *(char *)((long)puVar28 + lVar34 + -1));
            puVar33 = (ulong *)((long)puVar28 - uVar9);
            pBVar13 = (BYTE *)((long)puVar28 + (lVar34 - uVar9));
            uVar9 = uVar9 | 4;
            pUVar5[uVar35] = (int)puVar19 - iVar32;
            UVar38 = 1;
            uVar35 = uVar17;
            goto LAB_0190667f;
          }
          if ((uVar26 <= uVar31) &&
             (uVar30 = (ulong)uVar31, puVar40 = puVar19, (int)*puVar33 == *(int *)(pBVar6 + uVar30))
             ) goto LAB_01906739;
          uVar31 = pUVar5[uVar35];
          uVar30 = (ulong)uVar31;
          uVar23 = *puVar28 * -0x30e4432345000000 >> (bVar11 & 0x3f);
          uVar39 = (int)puVar19 - iVar32;
          pUVar5[uVar35] = uVar39;
          if ((uVar26 <= uVar31) && ((int)*puVar19 == *(int *)(pBVar6 + uVar30))) break;
          uVar31 = pUVar5[uVar23];
          uVar30 = uVar9;
          if (puVar18 <= (ulong *)((long)puVar28 + uVar9)) {
            puVar18 = puVar18 + 0x10;
            uVar30 = uVar9 + 1;
          }
          uVar35 = *puVar15;
          puVar40 = (ulong *)(uVar9 + (long)puVar15);
          puVar36 = (ulong *)((long)puVar28 + uVar9);
          uVar9 = uVar30;
          puVar33 = puVar28;
          puVar19 = puVar15;
          if (puVar14 <= puVar40) goto LAB_01906b7d;
        }
        uVar35 = uVar23;
        puVar40 = puVar28;
        puVar33 = puVar19;
        if (uVar9 < 5) {
LAB_01906739:
          pUVar5[uVar35] = (int)puVar40 - iVar32;
        }
        pBVar13 = pBVar6 + uVar30;
        uVar37 = (int)puVar33 - (int)pBVar13;
        uVar35 = (ulong)uVar37;
        UVar38 = uVar37 + 3;
        uVar9 = 4;
        uVar24 = uVar17;
        if ((uVar26 < uVar31) && (local_c0 < puVar33)) {
          pBVar3 = pBVar6 + (uVar30 - 1);
          puVar40 = puVar33;
          while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
                *(BYTE *)puVar33 == *pBVar13) {
            uVar9 = uVar9 + 1;
            if ((puVar33 <= local_c0) ||
               (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20)) goto LAB_0190667f;
          }
          pBVar13 = pBVar13 + 1;
          puVar33 = puVar40;
        }
LAB_0190667f:
        puVar40 = (ulong *)((long)puVar33 + uVar9);
        puVar36 = (ulong *)(pBVar13 + uVar9);
        puVar19 = puVar40;
        if (puVar40 < puVar27) {
          if (*puVar36 == *puVar40) {
            lVar34 = 0;
            do {
              puVar36 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
              if (puVar27 <= puVar36) {
                puVar36 = (ulong *)(pBVar13 + lVar34 + uVar9 + 8);
                puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
                goto LAB_019067e0;
              }
              lVar29 = lVar34 + uVar9 + 8;
              uVar17 = *puVar36;
              lVar34 = lVar34 + 8;
            } while (*(ulong *)(pBVar13 + lVar29) == uVar17);
            uVar17 = uVar17 ^ *(ulong *)(pBVar13 + lVar29);
            uVar23 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            local_c8 = (uVar23 >> 3 & 0x1fffffff) + lVar34;
          }
          else {
            uVar23 = *puVar40 ^ *puVar36;
            uVar17 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            local_c8 = uVar17 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_019067e0:
          if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar36 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar36 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar19 < puVar2) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar36 == (char)*puVar19));
          }
          local_c8 = (long)puVar19 - (long)puVar40;
        }
        uVar17 = (long)puVar33 - (long)local_c0;
        puVar40 = (ulong *)seqStore->lit;
        if (puVar1 < puVar33) {
          ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar1);
LAB_01906860:
          seqStore->lit = seqStore->lit + uVar17;
          psVar10 = seqStore->sequences;
          if (0xffff < uVar17) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar23 = local_c0[1];
          *puVar40 = *local_c0;
          puVar40[1] = uVar23;
          pBVar13 = seqStore->lit;
          if (0x10 < uVar17) {
            uVar23 = local_c0[3];
            *(ulong *)(pBVar13 + 0x10) = local_c0[2];
            *(ulong *)(pBVar13 + 0x18) = uVar23;
            if (0x20 < (long)uVar17) {
              lVar34 = 0;
              do {
                puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
                uVar7 = puVar4[1];
                pBVar3 = pBVar13 + lVar34 + 0x20;
                *(undefined8 *)pBVar3 = *puVar4;
                *(undefined8 *)(pBVar3 + 8) = uVar7;
                puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
                uVar7 = puVar4[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                lVar34 = lVar34 + 0x20;
              } while (pBVar3 + 0x20 < pBVar13 + uVar17);
            }
            goto LAB_01906860;
          }
          seqStore->lit = pBVar13 + uVar17;
          psVar10 = seqStore->sequences;
        }
        psVar10->litLength = (U16)uVar17;
        psVar10->offBase = UVar38;
        uVar17 = (local_c8 + uVar9) - 3;
        if (0xffff < uVar17) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar10->mlBase = (U16)uVar17;
        seqStore->sequences = psVar10 + 1;
        puVar33 = (ulong *)((long)puVar33 + local_c8 + uVar9);
        if (puVar33 <= puVar14) {
          pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar39 + 2) * -0x30e4432345000000) >>
                 (bVar11 & 0x3f)] = uVar39 + 2;
          pUVar5[(ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432345000000) >> (bVar11 & 0x3f)] =
               ((int)puVar33 + -2) - iVar32;
          if ((int)uVar24 == 0) {
            uVar24 = 0;
          }
          else {
            do {
              uVar17 = uVar35;
              uVar35 = uVar17;
              if ((int)*puVar33 != *(int *)((long)puVar33 - uVar24)) break;
              lVar34 = -uVar24;
              puVar40 = (ulong *)((long)puVar33 + 4);
              puVar19 = (ulong *)((long)puVar33 + lVar34 + 4);
              puVar36 = puVar40;
              if (puVar40 < puVar27) {
                if (*puVar19 == *puVar40) {
                  lVar29 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar33 + lVar29 + 0xc);
                    if (puVar27 <= puVar36) {
                      puVar19 = (ulong *)((long)puVar33 + lVar34 + lVar29 + 0xc);
                      puVar36 = (ulong *)((long)puVar33 + lVar29 + 0xc);
                      goto LAB_01906a3c;
                    }
                    uVar35 = *(ulong *)((long)puVar33 + lVar29 + lVar34 + 0xc);
                    uVar9 = *puVar36;
                    lVar29 = lVar29 + 8;
                  } while (uVar35 == uVar9);
                  uVar9 = uVar9 ^ uVar35;
                  uVar35 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar29;
                }
                else {
                  uVar9 = *puVar40 ^ *puVar19;
                  uVar35 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = uVar35 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_01906a3c:
                if ((puVar36 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar19 = (ulong *)((long)puVar19 + 4);
                }
                if ((puVar36 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar19 == (short)*puVar36)
                   ) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar19 = (ulong *)((long)puVar19 + 2);
                }
                if (puVar36 < puVar2) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar19 == (char)*puVar36));
                }
                uVar35 = (long)puVar36 - (long)puVar40;
              }
              pUVar5[*puVar33 * -0x30e4432345000000 >> (bVar11 & 0x3f)] = (int)puVar33 - iVar32;
              puVar40 = (ulong *)seqStore->lit;
              if (puVar1 < puVar33) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar40,(BYTE *)puVar33,(BYTE *)puVar33,(BYTE *)puVar1);
              }
              else {
                uVar9 = puVar33[1];
                *puVar40 = *puVar33;
                puVar40[1] = uVar9;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offBase = 1;
              if (0xffff < uVar35 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar33 = (ulong *)((long)puVar33 + uVar35 + 4);
              psVar10->mlBase = (U16)(uVar35 + 1);
              seqStore->sequences = psVar10 + 1;
              uVar35 = uVar24;
              uVar24 = uVar17;
            } while (puVar33 <= puVar14);
          }
        }
        local_c8._0_4_ = (uint)uVar24;
        puVar40 = (ulong *)((long)puVar33 + 3);
        uVar37 = (uint)uVar35;
        local_c0 = puVar33;
        uVar17 = uVar35;
      } while (puVar40 < puVar14);
    }
LAB_01906b7d:
    if (uVar22 <= uVar21) {
      uVar22 = 0;
    }
    uVar31 = uVar22;
    if (uVar37 != 0) {
      uVar31 = uVar8;
    }
    if (uVar8 <= uVar21) {
      uVar31 = uVar22;
      uVar8 = 0;
    }
    if (uVar37 != 0) {
      uVar8 = uVar37;
    }
    *rep = uVar8;
    if ((uint)local_c8 != 0) {
      uVar31 = (uint)local_c8;
    }
    rep[1] = uVar31;
    goto LAB_019079d0;
  }
  if (uVar31 == 6) {
    if (puVar40 < puVar14) {
      bVar11 = 0x40 - (char)(ms->cParams).hashLog;
      puVar27 = (ulong *)((long)puVar2 - 7);
      puVar1 = puVar2 + -4;
      local_c0 = (ulong *)src;
      do {
        local_c8._0_4_ = (uint)uVar24;
        puVar18 = puVar33 + 0x10;
        uVar23 = *puVar33 * -0x30e4432340650000 >> (bVar11 & 0x3f);
        uVar35 = *(ulong *)((long)puVar33 + 1);
        uVar31 = pUVar5[uVar23];
        uVar37 = (uint)uVar17;
        lVar34 = -uVar17;
        puVar36 = (ulong *)((long)puVar33 + 2);
        uVar9 = 2;
        puVar19 = (ulong *)((long)puVar33 + 1);
        while( true ) {
          puVar28 = puVar36;
          puVar15 = puVar40;
          uVar35 = uVar35 * -0x30e4432340650000 >> (bVar11 & 0x3f);
          uVar39 = (int)puVar33 - iVar32;
          iVar16 = *(int *)((long)puVar28 + lVar34);
          pUVar5[uVar23] = uVar39;
          if ((uVar37 != 0) && ((int)*puVar28 == iVar16)) {
            uVar9 = (ulong)(*(char *)((long)puVar28 - 1) == *(char *)((long)puVar28 + lVar34 + -1));
            puVar33 = (ulong *)((long)puVar28 - uVar9);
            pBVar13 = (BYTE *)((long)puVar28 + (lVar34 - uVar9));
            uVar9 = uVar9 | 4;
            pUVar5[uVar35] = (int)puVar19 - iVar32;
            UVar38 = 1;
            uVar35 = uVar17;
            goto LAB_019058db;
          }
          if ((uVar26 <= uVar31) &&
             (uVar30 = (ulong)uVar31, puVar40 = puVar19, (int)*puVar33 == *(int *)(pBVar6 + uVar30))
             ) goto LAB_01905995;
          uVar31 = pUVar5[uVar35];
          uVar30 = (ulong)uVar31;
          uVar23 = *puVar28 * -0x30e4432340650000 >> (bVar11 & 0x3f);
          uVar39 = (int)puVar19 - iVar32;
          pUVar5[uVar35] = uVar39;
          if ((uVar26 <= uVar31) && ((int)*puVar19 == *(int *)(pBVar6 + uVar30))) break;
          uVar31 = pUVar5[uVar23];
          uVar30 = uVar9;
          if (puVar18 <= (ulong *)((long)puVar28 + uVar9)) {
            puVar18 = puVar18 + 0x10;
            uVar30 = uVar9 + 1;
          }
          uVar35 = *puVar15;
          puVar40 = (ulong *)(uVar9 + (long)puVar15);
          puVar36 = (ulong *)((long)puVar28 + uVar9);
          uVar9 = uVar30;
          puVar33 = puVar28;
          puVar19 = puVar15;
          if (puVar14 <= puVar40) goto LAB_01906b7d;
        }
        uVar35 = uVar23;
        puVar40 = puVar28;
        puVar33 = puVar19;
        if (uVar9 < 5) {
LAB_01905995:
          pUVar5[uVar35] = (int)puVar40 - iVar32;
        }
        pBVar13 = pBVar6 + uVar30;
        uVar37 = (int)puVar33 - (int)pBVar13;
        uVar35 = (ulong)uVar37;
        UVar38 = uVar37 + 3;
        uVar9 = 4;
        uVar24 = uVar17;
        if ((uVar26 < uVar31) && (local_c0 < puVar33)) {
          pBVar3 = pBVar6 + (uVar30 - 1);
          puVar40 = puVar33;
          while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
                *(BYTE *)puVar33 == *pBVar13) {
            uVar9 = uVar9 + 1;
            if ((puVar33 <= local_c0) ||
               (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20)) goto LAB_019058db;
          }
          pBVar13 = pBVar13 + 1;
          puVar33 = puVar40;
        }
LAB_019058db:
        puVar40 = (ulong *)((long)puVar33 + uVar9);
        puVar36 = (ulong *)(pBVar13 + uVar9);
        puVar19 = puVar40;
        if (puVar40 < puVar27) {
          if (*puVar36 == *puVar40) {
            lVar34 = 0;
            do {
              puVar36 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
              if (puVar27 <= puVar36) {
                puVar36 = (ulong *)(pBVar13 + lVar34 + uVar9 + 8);
                puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
                goto LAB_01905a3c;
              }
              lVar29 = lVar34 + uVar9 + 8;
              uVar17 = *puVar36;
              lVar34 = lVar34 + 8;
            } while (*(ulong *)(pBVar13 + lVar29) == uVar17);
            uVar17 = uVar17 ^ *(ulong *)(pBVar13 + lVar29);
            uVar23 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            local_c8 = (uVar23 >> 3 & 0x1fffffff) + lVar34;
          }
          else {
            uVar23 = *puVar40 ^ *puVar36;
            uVar17 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            local_c8 = uVar17 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_01905a3c:
          if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar36 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar36 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar19 < puVar2) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar36 == (char)*puVar19));
          }
          local_c8 = (long)puVar19 - (long)puVar40;
        }
        uVar17 = (long)puVar33 - (long)local_c0;
        puVar40 = (ulong *)seqStore->lit;
        if (puVar1 < puVar33) {
          ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar1);
LAB_01905abc:
          seqStore->lit = seqStore->lit + uVar17;
          psVar10 = seqStore->sequences;
          if (0xffff < uVar17) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar23 = local_c0[1];
          *puVar40 = *local_c0;
          puVar40[1] = uVar23;
          pBVar13 = seqStore->lit;
          if (0x10 < uVar17) {
            uVar23 = local_c0[3];
            *(ulong *)(pBVar13 + 0x10) = local_c0[2];
            *(ulong *)(pBVar13 + 0x18) = uVar23;
            if (0x20 < (long)uVar17) {
              lVar34 = 0;
              do {
                puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
                uVar7 = puVar4[1];
                pBVar3 = pBVar13 + lVar34 + 0x20;
                *(undefined8 *)pBVar3 = *puVar4;
                *(undefined8 *)(pBVar3 + 8) = uVar7;
                puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
                uVar7 = puVar4[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                lVar34 = lVar34 + 0x20;
              } while (pBVar3 + 0x20 < pBVar13 + uVar17);
            }
            goto LAB_01905abc;
          }
          seqStore->lit = pBVar13 + uVar17;
          psVar10 = seqStore->sequences;
        }
        psVar10->litLength = (U16)uVar17;
        psVar10->offBase = UVar38;
        uVar17 = (local_c8 + uVar9) - 3;
        if (0xffff < uVar17) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar10->mlBase = (U16)uVar17;
        seqStore->sequences = psVar10 + 1;
        puVar33 = (ulong *)((long)puVar33 + local_c8 + uVar9);
        if (puVar33 <= puVar14) {
          pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar39 + 2) * -0x30e4432340650000) >>
                 (bVar11 & 0x3f)] = uVar39 + 2;
          pUVar5[(ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432340650000) >> (bVar11 & 0x3f)] =
               ((int)puVar33 + -2) - iVar32;
          if ((int)uVar24 == 0) {
            uVar24 = 0;
          }
          else {
            do {
              uVar17 = uVar35;
              uVar35 = uVar17;
              if ((int)*puVar33 != *(int *)((long)puVar33 - uVar24)) break;
              lVar34 = -uVar24;
              puVar40 = (ulong *)((long)puVar33 + 4);
              puVar19 = (ulong *)((long)puVar33 + lVar34 + 4);
              puVar36 = puVar40;
              if (puVar40 < puVar27) {
                if (*puVar19 == *puVar40) {
                  lVar29 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar33 + lVar29 + 0xc);
                    if (puVar27 <= puVar36) {
                      puVar19 = (ulong *)((long)puVar33 + lVar34 + lVar29 + 0xc);
                      puVar36 = (ulong *)((long)puVar33 + lVar29 + 0xc);
                      goto LAB_01905c90;
                    }
                    uVar35 = *(ulong *)((long)puVar33 + lVar29 + lVar34 + 0xc);
                    uVar9 = *puVar36;
                    lVar29 = lVar29 + 8;
                  } while (uVar35 == uVar9);
                  uVar9 = uVar9 ^ uVar35;
                  uVar35 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar29;
                }
                else {
                  uVar9 = *puVar40 ^ *puVar19;
                  uVar35 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = uVar35 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_01905c90:
                if ((puVar36 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar19 = (ulong *)((long)puVar19 + 4);
                }
                if ((puVar36 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar19 == (short)*puVar36)
                   ) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar19 = (ulong *)((long)puVar19 + 2);
                }
                if (puVar36 < puVar2) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar19 == (char)*puVar36));
                }
                uVar35 = (long)puVar36 - (long)puVar40;
              }
              pUVar5[*puVar33 * -0x30e4432340650000 >> (bVar11 & 0x3f)] = (int)puVar33 - iVar32;
              puVar40 = (ulong *)seqStore->lit;
              if (puVar1 < puVar33) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar40,(BYTE *)puVar33,(BYTE *)puVar33,(BYTE *)puVar1);
              }
              else {
                uVar9 = puVar33[1];
                *puVar40 = *puVar33;
                puVar40[1] = uVar9;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offBase = 1;
              if (0xffff < uVar35 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar33 = (ulong *)((long)puVar33 + uVar35 + 4);
              psVar10->mlBase = (U16)(uVar35 + 1);
              seqStore->sequences = psVar10 + 1;
              uVar35 = uVar24;
              uVar24 = uVar17;
            } while (puVar33 <= puVar14);
          }
        }
        local_c8._0_4_ = (uint)uVar24;
        puVar40 = (ulong *)((long)puVar33 + 3);
        uVar37 = (uint)uVar35;
        local_c0 = puVar33;
        uVar17 = uVar35;
      } while (puVar40 < puVar14);
    }
    goto LAB_01906b7d;
  }
  if (uVar31 == 7) {
    if (puVar40 < puVar14) {
      bVar11 = 0x40 - (char)(ms->cParams).hashLog;
      puVar27 = (ulong *)((long)puVar2 - 7);
      puVar1 = puVar2 + -4;
      local_c0 = (ulong *)src;
      do {
        local_c8._0_4_ = (uint)uVar24;
        puVar18 = puVar33 + 0x10;
        uVar23 = *puVar33 * -0x30e44323405a9d00 >> (bVar11 & 0x3f);
        uVar35 = *(ulong *)((long)puVar33 + 1);
        uVar31 = pUVar5[uVar23];
        uVar37 = (uint)uVar17;
        lVar34 = -uVar17;
        puVar36 = (ulong *)((long)puVar33 + 2);
        uVar9 = 2;
        puVar19 = (ulong *)((long)puVar33 + 1);
        while( true ) {
          puVar28 = puVar36;
          puVar15 = puVar40;
          uVar35 = uVar35 * -0x30e44323405a9d00 >> (bVar11 & 0x3f);
          uVar39 = (int)puVar33 - iVar32;
          iVar16 = *(int *)((long)puVar28 + lVar34);
          pUVar5[uVar23] = uVar39;
          if ((uVar37 != 0) && ((int)*puVar28 == iVar16)) {
            uVar9 = (ulong)(*(char *)((long)puVar28 - 1) == *(char *)((long)puVar28 + lVar34 + -1));
            puVar33 = (ulong *)((long)puVar28 - uVar9);
            pBVar13 = (BYTE *)((long)puVar28 + (lVar34 - uVar9));
            uVar9 = uVar9 | 4;
            pUVar5[uVar35] = (int)puVar19 - iVar32;
            UVar38 = 1;
            uVar35 = uVar17;
            goto LAB_01904b5a;
          }
          if ((uVar26 <= uVar31) &&
             (uVar30 = (ulong)uVar31, puVar40 = puVar19, (int)*puVar33 == *(int *)(pBVar6 + uVar30))
             ) goto LAB_01904c14;
          uVar31 = pUVar5[uVar35];
          uVar30 = (ulong)uVar31;
          uVar23 = *puVar28 * -0x30e44323405a9d00 >> (bVar11 & 0x3f);
          uVar39 = (int)puVar19 - iVar32;
          pUVar5[uVar35] = uVar39;
          if ((uVar26 <= uVar31) && ((int)*puVar19 == *(int *)(pBVar6 + uVar30))) break;
          uVar31 = pUVar5[uVar23];
          uVar30 = uVar9;
          if (puVar18 <= (ulong *)((long)puVar28 + uVar9)) {
            puVar18 = puVar18 + 0x10;
            uVar30 = uVar9 + 1;
          }
          uVar35 = *puVar15;
          puVar40 = (ulong *)(uVar9 + (long)puVar15);
          puVar36 = (ulong *)((long)puVar28 + uVar9);
          uVar9 = uVar30;
          puVar33 = puVar28;
          puVar19 = puVar15;
          if (puVar14 <= puVar40) goto LAB_01906b7d;
        }
        uVar35 = uVar23;
        puVar40 = puVar28;
        puVar33 = puVar19;
        if (uVar9 < 5) {
LAB_01904c14:
          pUVar5[uVar35] = (int)puVar40 - iVar32;
        }
        pBVar13 = pBVar6 + uVar30;
        uVar37 = (int)puVar33 - (int)pBVar13;
        uVar35 = (ulong)uVar37;
        UVar38 = uVar37 + 3;
        uVar9 = 4;
        uVar24 = uVar17;
        if ((uVar26 < uVar31) && (local_c0 < puVar33)) {
          pBVar3 = pBVar6 + (uVar30 - 1);
          puVar40 = puVar33;
          while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
                *(BYTE *)puVar33 == *pBVar13) {
            uVar9 = uVar9 + 1;
            if ((puVar33 <= local_c0) ||
               (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20)) goto LAB_01904b5a;
          }
          pBVar13 = pBVar13 + 1;
          puVar33 = puVar40;
        }
LAB_01904b5a:
        puVar40 = (ulong *)((long)puVar33 + uVar9);
        puVar36 = (ulong *)(pBVar13 + uVar9);
        puVar19 = puVar40;
        if (puVar40 < puVar27) {
          if (*puVar36 == *puVar40) {
            lVar34 = 0;
            do {
              puVar36 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
              if (puVar27 <= puVar36) {
                puVar36 = (ulong *)(pBVar13 + lVar34 + uVar9 + 8);
                puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
                goto LAB_01904cbb;
              }
              lVar29 = lVar34 + uVar9 + 8;
              uVar17 = *puVar36;
              lVar34 = lVar34 + 8;
            } while (*(ulong *)(pBVar13 + lVar29) == uVar17);
            uVar17 = uVar17 ^ *(ulong *)(pBVar13 + lVar29);
            uVar23 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            local_c8 = (uVar23 >> 3 & 0x1fffffff) + lVar34;
          }
          else {
            uVar23 = *puVar40 ^ *puVar36;
            uVar17 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            local_c8 = uVar17 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_01904cbb:
          if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar36 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar36 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar19 < puVar2) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar36 == (char)*puVar19));
          }
          local_c8 = (long)puVar19 - (long)puVar40;
        }
        uVar17 = (long)puVar33 - (long)local_c0;
        puVar40 = (ulong *)seqStore->lit;
        if (puVar1 < puVar33) {
          ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar1);
LAB_01904d3b:
          seqStore->lit = seqStore->lit + uVar17;
          psVar10 = seqStore->sequences;
          if (0xffff < uVar17) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar23 = local_c0[1];
          *puVar40 = *local_c0;
          puVar40[1] = uVar23;
          pBVar13 = seqStore->lit;
          if (0x10 < uVar17) {
            uVar23 = local_c0[3];
            *(ulong *)(pBVar13 + 0x10) = local_c0[2];
            *(ulong *)(pBVar13 + 0x18) = uVar23;
            if (0x20 < (long)uVar17) {
              lVar34 = 0;
              do {
                puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
                uVar7 = puVar4[1];
                pBVar3 = pBVar13 + lVar34 + 0x20;
                *(undefined8 *)pBVar3 = *puVar4;
                *(undefined8 *)(pBVar3 + 8) = uVar7;
                puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
                uVar7 = puVar4[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                lVar34 = lVar34 + 0x20;
              } while (pBVar3 + 0x20 < pBVar13 + uVar17);
            }
            goto LAB_01904d3b;
          }
          seqStore->lit = pBVar13 + uVar17;
          psVar10 = seqStore->sequences;
        }
        psVar10->litLength = (U16)uVar17;
        psVar10->offBase = UVar38;
        uVar17 = (local_c8 + uVar9) - 3;
        if (0xffff < uVar17) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar10->mlBase = (U16)uVar17;
        seqStore->sequences = psVar10 + 1;
        puVar33 = (ulong *)((long)puVar33 + local_c8 + uVar9);
        if (puVar33 <= puVar14) {
          pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar39 + 2) * -0x30e44323405a9d00) >>
                 (bVar11 & 0x3f)] = uVar39 + 2;
          pUVar5[(ulong)(*(long *)((long)puVar33 + -2) * -0x30e44323405a9d00) >> (bVar11 & 0x3f)] =
               ((int)puVar33 + -2) - iVar32;
          if ((int)uVar24 == 0) {
            uVar24 = 0;
          }
          else {
            do {
              uVar17 = uVar35;
              uVar35 = uVar17;
              if ((int)*puVar33 != *(int *)((long)puVar33 - uVar24)) break;
              lVar34 = -uVar24;
              puVar40 = (ulong *)((long)puVar33 + 4);
              puVar19 = (ulong *)((long)puVar33 + lVar34 + 4);
              puVar36 = puVar40;
              if (puVar40 < puVar27) {
                if (*puVar19 == *puVar40) {
                  lVar29 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar33 + lVar29 + 0xc);
                    if (puVar27 <= puVar36) {
                      puVar19 = (ulong *)((long)puVar33 + lVar34 + lVar29 + 0xc);
                      puVar36 = (ulong *)((long)puVar33 + lVar29 + 0xc);
                      goto LAB_01904f0f;
                    }
                    uVar35 = *(ulong *)((long)puVar33 + lVar29 + lVar34 + 0xc);
                    uVar9 = *puVar36;
                    lVar29 = lVar29 + 8;
                  } while (uVar35 == uVar9);
                  uVar9 = uVar9 ^ uVar35;
                  uVar35 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar29;
                }
                else {
                  uVar9 = *puVar40 ^ *puVar19;
                  uVar35 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = uVar35 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_01904f0f:
                if ((puVar36 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar19 = (ulong *)((long)puVar19 + 4);
                }
                if ((puVar36 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar19 == (short)*puVar36)
                   ) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar19 = (ulong *)((long)puVar19 + 2);
                }
                if (puVar36 < puVar2) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar19 == (char)*puVar36));
                }
                uVar35 = (long)puVar36 - (long)puVar40;
              }
              pUVar5[*puVar33 * -0x30e44323405a9d00 >> (bVar11 & 0x3f)] = (int)puVar33 - iVar32;
              puVar40 = (ulong *)seqStore->lit;
              if (puVar1 < puVar33) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar40,(BYTE *)puVar33,(BYTE *)puVar33,(BYTE *)puVar1);
              }
              else {
                uVar9 = puVar33[1];
                *puVar40 = *puVar33;
                puVar40[1] = uVar9;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offBase = 1;
              if (0xffff < uVar35 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar33 = (ulong *)((long)puVar33 + uVar35 + 4);
              psVar10->mlBase = (U16)(uVar35 + 1);
              seqStore->sequences = psVar10 + 1;
              uVar35 = uVar24;
              uVar24 = uVar17;
            } while (puVar33 <= puVar14);
          }
        }
        local_c8._0_4_ = (uint)uVar24;
        puVar40 = (ulong *)((long)puVar33 + 3);
        uVar37 = (uint)uVar35;
        local_c0 = puVar33;
        uVar17 = uVar35;
      } while (puVar40 < puVar14);
    }
    goto LAB_01906b7d;
  }
  if (puVar40 < puVar14) {
    bVar11 = 0x20 - (char)(ms->cParams).hashLog;
    puVar27 = (ulong *)((long)puVar2 - 7);
    puVar1 = puVar2 + -4;
    do {
      puVar18 = puVar33 + 0x10;
      uVar9 = (ulong)((uint)((int)*puVar33 * -0x61c8864f) >> (bVar11 & 0x1f));
      iVar16 = *(int *)((long)puVar33 + 1);
      uVar31 = pUVar5[uVar9];
      lVar34 = -uVar17;
      puVar36 = (ulong *)((long)puVar33 + 2);
      puVar19 = (ulong *)((long)puVar33 + 1);
      uVar35 = 2;
      while( true ) {
        puVar28 = puVar36;
        puVar15 = puVar40;
        uVar23 = (ulong)((uint)(iVar16 * -0x61c8864f) >> (bVar11 & 0x1f));
        uVar39 = (int)puVar33 - iVar32;
        iVar16 = *(int *)((long)puVar28 + lVar34);
        pUVar5[uVar9] = uVar39;
        uVar37 = (uint)uVar17;
        if ((uVar37 != 0) && ((int)*puVar28 == iVar16)) {
          uVar9 = (ulong)(*(char *)((long)puVar28 - 1) == *(char *)((long)puVar28 + lVar34 + -1));
          puVar33 = (ulong *)((long)puVar28 - uVar9);
          pBVar13 = (BYTE *)((long)puVar28 + (lVar34 - uVar9));
          uVar9 = uVar9 | 4;
          pUVar5[uVar23] = (int)puVar19 - iVar32;
          UVar38 = 1;
          uVar35 = uVar17;
          goto LAB_0190743a;
        }
        if ((uVar26 <= uVar31) &&
           (uVar30 = (ulong)uVar31, (int)*puVar33 == *(int *)(pBVar6 + uVar30))) goto LAB_019074fa;
        local_c8._0_4_ = (uint)uVar24;
        uVar31 = pUVar5[uVar23];
        uVar30 = (ulong)uVar31;
        uVar9 = (ulong)((uint)((int)*puVar28 * -0x61c8864f) >> (bVar11 & 0x1f));
        uVar39 = (int)puVar19 - iVar32;
        pUVar5[uVar23] = uVar39;
        if ((uVar26 <= uVar31) && ((int)*puVar19 == *(int *)(pBVar6 + uVar30))) break;
        uVar31 = pUVar5[uVar9];
        uVar23 = uVar35;
        if (puVar18 <= (ulong *)((long)puVar28 + uVar35)) {
          puVar18 = puVar18 + 0x10;
          uVar23 = uVar35 + 1;
        }
        iVar16 = (int)*puVar15;
        puVar40 = (ulong *)(uVar35 + (long)puVar15);
        puVar36 = (ulong *)((long)puVar28 + uVar35);
        puVar19 = puVar15;
        uVar35 = uVar23;
        puVar33 = puVar28;
        if (puVar14 <= puVar40) goto LAB_019079fd;
      }
      uVar23 = uVar9;
      puVar33 = puVar19;
      puVar19 = puVar28;
      if (uVar35 < 5) {
LAB_019074fa:
        pUVar5[uVar23] = (int)puVar19 - iVar32;
      }
      pBVar13 = pBVar6 + uVar30;
      uVar37 = (int)puVar33 - (int)pBVar13;
      uVar35 = (ulong)uVar37;
      UVar38 = uVar37 + 3;
      uVar9 = 4;
      uVar24 = uVar17;
      if ((uVar26 < uVar31) && (local_c0 < puVar33)) {
        pBVar3 = pBVar6 + (uVar30 - 1);
        puVar40 = puVar33;
        while (pBVar13 = pBVar3, puVar33 = (ulong *)((long)puVar40 + -1),
              *(BYTE *)puVar33 == *pBVar13) {
          uVar9 = uVar9 + 1;
          if ((puVar33 <= local_c0) ||
             (pBVar3 = pBVar13 + -1, puVar40 = puVar33, pBVar13 <= pBVar20)) goto LAB_0190743a;
        }
        pBVar13 = pBVar13 + 1;
        puVar33 = puVar40;
      }
LAB_0190743a:
      puVar40 = (ulong *)((long)puVar33 + uVar9);
      puVar36 = (ulong *)(pBVar13 + uVar9);
      puVar19 = puVar40;
      if (puVar40 < puVar27) {
        if (*puVar36 == *puVar40) {
          lVar34 = 0;
          do {
            puVar36 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
            if (puVar27 <= puVar36) {
              puVar36 = (ulong *)(pBVar13 + lVar34 + uVar9 + 8);
              puVar19 = (ulong *)((long)puVar33 + lVar34 + uVar9 + 8);
              goto LAB_019075a9;
            }
            lVar29 = lVar34 + uVar9 + 8;
            uVar17 = *puVar36;
            lVar34 = lVar34 + 8;
          } while (*(ulong *)(pBVar13 + lVar29) == uVar17);
          uVar17 = uVar17 ^ *(ulong *)(pBVar13 + lVar29);
          uVar23 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          local_68 = (uVar23 >> 3 & 0x1fffffff) + lVar34;
        }
        else {
          uVar23 = *puVar40 ^ *puVar36;
          uVar17 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          local_68 = uVar17 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_019075a9:
        if ((puVar19 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar36 == (int)*puVar19)) {
          puVar19 = (ulong *)((long)puVar19 + 4);
          puVar36 = (ulong *)((long)puVar36 + 4);
        }
        if ((puVar19 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar36 == (short)*puVar19)) {
          puVar19 = (ulong *)((long)puVar19 + 2);
          puVar36 = (ulong *)((long)puVar36 + 2);
        }
        if (puVar19 < puVar2) {
          puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar36 == (char)*puVar19));
        }
        local_68 = (long)puVar19 - (long)puVar40;
      }
      uVar17 = (long)puVar33 - (long)local_c0;
      puVar40 = (ulong *)seqStore->lit;
      if (puVar1 < puVar33) {
        ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)local_c0,(BYTE *)puVar33,(BYTE *)puVar1);
LAB_01907622:
        seqStore->lit = seqStore->lit + uVar17;
        psVar10 = seqStore->sequences;
        if (0xffff < uVar17) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar23 = local_c0[1];
        *puVar40 = *local_c0;
        puVar40[1] = uVar23;
        pBVar13 = seqStore->lit;
        if (0x10 < uVar17) {
          uVar23 = local_c0[3];
          *(ulong *)(pBVar13 + 0x10) = local_c0[2];
          *(ulong *)(pBVar13 + 0x18) = uVar23;
          if (0x20 < (long)uVar17) {
            lVar34 = 0;
            do {
              puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x20);
              uVar7 = puVar4[1];
              pBVar3 = pBVar13 + lVar34 + 0x20;
              *(undefined8 *)pBVar3 = *puVar4;
              *(undefined8 *)(pBVar3 + 8) = uVar7;
              puVar4 = (undefined8 *)((long)local_c0 + lVar34 + 0x30);
              uVar7 = puVar4[1];
              *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar3 + 0x18) = uVar7;
              lVar34 = lVar34 + 0x20;
            } while (pBVar3 + 0x20 < pBVar13 + uVar17);
          }
          goto LAB_01907622;
        }
        seqStore->lit = pBVar13 + uVar17;
        psVar10 = seqStore->sequences;
      }
      psVar10->litLength = (U16)uVar17;
      psVar10->offBase = UVar38;
      uVar17 = (local_68 + uVar9) - 3;
      if (0xffff < uVar17) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar10->mlBase = (U16)uVar17;
      seqStore->sequences = psVar10 + 1;
      local_c0 = (ulong *)((long)puVar33 + local_68 + uVar9);
      if (local_c0 <= puVar14) {
        pUVar5[(uint)(*(int *)(pBVar6 + (ulong)uVar39 + 2) * -0x61c8864f) >> (bVar11 & 0x1f)] =
             uVar39 + 2;
        pUVar5[(uint)(*(int *)((long)local_c0 + -2) * -0x61c8864f) >> (bVar11 & 0x1f)] =
             ((int)local_c0 + -2) - iVar32;
        if ((int)uVar24 == 0) {
          uVar24 = 0;
        }
        else {
          do {
            uVar17 = uVar35;
            uVar35 = uVar17;
            if ((int)*local_c0 != *(int *)((long)local_c0 - uVar24)) break;
            lVar34 = -uVar24;
            puVar33 = (ulong *)((long)local_c0 + 4);
            puVar36 = (ulong *)((long)local_c0 + lVar34 + 4);
            puVar40 = puVar33;
            if (puVar33 < puVar27) {
              if (*puVar36 == *puVar33) {
                lVar29 = 0;
                do {
                  puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                  if (puVar27 <= puVar40) {
                    puVar36 = (ulong *)((long)local_c0 + lVar34 + lVar29 + 0xc);
                    puVar40 = (ulong *)((long)local_c0 + lVar29 + 0xc);
                    goto LAB_01907808;
                  }
                  uVar35 = *(ulong *)((long)local_c0 + lVar29 + lVar34 + 0xc);
                  uVar9 = *puVar40;
                  lVar29 = lVar29 + 8;
                } while (uVar35 == uVar9);
                uVar9 = uVar9 ^ uVar35;
                uVar35 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar29;
              }
              else {
                uVar9 = *puVar33 ^ *puVar36;
                uVar35 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_01907808:
              if ((puVar40 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar36 == (int)*puVar40)) {
                puVar40 = (ulong *)((long)puVar40 + 4);
                puVar36 = (ulong *)((long)puVar36 + 4);
              }
              if ((puVar40 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar36 == (short)*puVar40))
              {
                puVar40 = (ulong *)((long)puVar40 + 2);
                puVar36 = (ulong *)((long)puVar36 + 2);
              }
              if (puVar40 < puVar2) {
                puVar40 = (ulong *)((long)puVar40 + (ulong)((char)*puVar36 == (char)*puVar40));
              }
              uVar35 = (long)puVar40 - (long)puVar33;
            }
            pUVar5[(uint)((int)*local_c0 * -0x61c8864f) >> (bVar11 & 0x1f)] = (int)local_c0 - iVar32
            ;
            puVar33 = (ulong *)seqStore->lit;
            if (puVar1 < local_c0) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar33,(BYTE *)local_c0,(BYTE *)local_c0,(BYTE *)puVar1);
            }
            else {
              uVar9 = local_c0[1];
              *puVar33 = *local_c0;
              puVar33[1] = uVar9;
            }
            psVar10 = seqStore->sequences;
            psVar10->litLength = 0;
            psVar10->offBase = 1;
            if (0xffff < uVar35 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
            }
            local_c0 = (ulong *)((long)local_c0 + uVar35 + 4);
            psVar10->mlBase = (U16)(uVar35 + 1);
            seqStore->sequences = psVar10 + 1;
            uVar35 = uVar24;
            uVar24 = uVar17;
          } while (local_c0 <= puVar14);
        }
      }
      local_c8._0_4_ = (uint)uVar24;
      puVar40 = (ulong *)((long)local_c0 + 3);
      uVar37 = (uint)uVar35;
      puVar33 = local_c0;
      uVar17 = uVar35;
    } while (puVar40 < puVar14);
  }
LAB_019079fd:
  if (uVar22 <= uVar21) {
    uVar22 = 0;
  }
  uVar31 = uVar22;
  if (uVar37 != 0) {
    uVar31 = uVar8;
  }
  if (uVar8 <= uVar21) {
    uVar31 = uVar22;
    uVar8 = 0;
  }
  if (uVar37 != 0) {
    uVar8 = uVar37;
  }
  *rep = uVar8;
  if ((uint)local_c8 != 0) {
    uVar31 = (uint)local_c8;
  }
  goto LAB_019079cd;
LAB_0190793a:
  goto LAB_0190794b;
LAB_0190797d:
LAB_0190798e:
  if (uVar26 <= uVar37) {
    uVar26 = 0;
  }
  uVar31 = uVar26;
  if (uVar21 != 0) {
    uVar31 = uVar8;
  }
  if (uVar8 <= uVar37) {
    uVar31 = uVar26;
    uVar8 = 0;
  }
  if (uVar21 != 0) {
    uVar8 = uVar21;
  }
LAB_019079be:
  *rep = uVar8;
  if ((uint)local_b8 != 0) {
    uVar31 = (uint)local_b8;
  }
LAB_019079cd:
  rep[1] = uVar31;
LAB_019079d0:
  return (long)src + (srcSize - (long)local_c0);
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}